

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<unsigned_short>>,std::tuple<unsigned_short>>
               (tuple<testing::Matcher<unsigned_short>_> *matchers,tuple<unsigned_short> *values,
               ostream *os)

{
  MatcherInterface<const_unsigned_short_&> *pMVar1;
  int iVar2;
  ostream *poVar3;
  type matcher;
  StringMatchResultListener listener;
  MatcherBase<unsigned_short> MStack_1e8;
  string local_1d0;
  StringMatchResultListener local_1b0;
  
  Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&MStack_1e8,(Matcher<unsigned_short> *)matchers);
  StringMatchResultListener::StringMatchResultListener(&local_1b0);
  iVar2 = (*((MStack_1e8.impl_.value_)->super_MatcherDescriberInterface).
            _vptr_MatcherDescriberInterface[4])(MStack_1e8.impl_.value_,values,&local_1b0);
  if ((char)iVar2 == '\0') {
    poVar3 = std::operator<<(os,"  Expected arg #");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,": ");
    pMVar1 = (matchers->super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>_>).
             super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
             super_MatcherBase<unsigned_short>.impl_.value_;
    (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])(pMVar1,os);
    std::operator<<(os,"\n           Actual: ");
    testing_internal::DefaultPrintNonContainerTo<unsigned_short>((unsigned_short *)values,os);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d0,os);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&local_1b0);
  MatcherBase<unsigned_short>::~MatcherBase(&MStack_1e8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    GTEST_REFERENCE_TO_CONST_(Value) value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // FIXME: include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }